

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O0

UINT8 device_start_saa1099_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData_00;
  UINT32 local_34;
  UINT32 rate;
  DEV_DATA *devData;
  void *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  local_34 = cfg->clock >> 7;
  if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (local_34 < cfg->smplRate)))) {
    local_34 = cfg->smplRate;
  }
  devData_00.chipInf = saa1099m_create(cfg->clock,local_34);
  if ((DEV_DATA *)devData_00.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    *(void **)devData_00.chipInf = devData_00.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData_00.chipInf,local_34,&devDef_SAA1099_MAME);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_saa1099_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 128;	// /128 seems right based on the highest noise frequency
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = saa1099m_create(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SAA1099_MAME);
	return 0x00;
}